

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O3

S2Point * __thiscall
S2::PlateCarreeProjection::Unproject
          (S2Point *__return_storage_ptr__,PlateCarreeProjection *this,R2Point *p)

{
  double dVar1;
  double dVar2;
  S2LatLng local_18;
  
  dVar1 = this->to_radians_;
  dVar2 = p->c_[1];
  local_18.coords_.c_[1] = remainder(p->c_[0],this->x_wrap_);
  local_18.coords_.c_[0] = dVar2 * dVar1;
  local_18.coords_.c_[1] = local_18.coords_.c_[1] * dVar1;
  S2LatLng::ToPoint(__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

S2Point PlateCarreeProjection::Unproject(const R2Point& p) const {
  return ToLatLng(p).ToPoint();
}